

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O1

void __thiscall
hbm::streaming::SubscribedSignal::processSignalMetaInformation
          (SubscribedSignal *this,string *method,Value *params)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Value *this_00;
  size_t in_RCX;
  undefined1 local_b0 [48];
  _func_int *local_80 [12];
  
  iVar2 = std::__cxx11::string::compare((char *)method);
  if (iVar2 == 0) {
    bVar1 = Json::Value::empty(params);
    if (!bVar1) {
      this_00 = Json::Value::operator[](params,0);
      Json::Value::asString_abi_cxx11_((string *)(local_b0 + 0x20),this_00);
      std::__cxx11::string::operator=
                ((string *)&this->m_signalReference,(string *)(local_b0 + 0x20));
      if ((_func_int **)local_b0._32_8_ != local_80) {
        operator_delete((void *)local_b0._32_8_);
      }
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)method);
    if (iVar2 == 0) {
      deltaTimeInfo::setTime(&this->m_syncSignalTime,params);
      return;
    }
    iVar2 = std::__cxx11::string::compare((char *)method);
    if (iVar2 == 0) {
      setDataFormat(this,params);
      return;
    }
    iVar2 = std::__cxx11::string::compare((char *)method);
    if (iVar2 == 0) {
      Json::StyledWriter::StyledWriter((StyledWriter *)(local_b0 + 0x20));
      Json::StyledWriter::write_abi_cxx11_
                ((StyledWriter *)local_b0,(int)local_b0 + 0x20,params,in_RCX);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_b0._0_8_,local_b0._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_);
      }
      Json::StyledWriter::~StyledWriter((StyledWriter *)(local_b0 + 0x20));
      deltaTimeInfo::setDelta(&this->m_syncSignalTime,params);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"unhandled signal related meta information \'",0x2b);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(method->_M_dataplus)._M_p,method->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' for signal ",0xd);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(this->m_signalReference)._M_dataplus._M_p,
                          (this->m_signalReference)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," with parameters: ",0x12);
      Json::StyledWriter::StyledWriter((StyledWriter *)(local_b0 + 0x20));
      Json::StyledWriter::write_abi_cxx11_
                ((StyledWriter *)local_b0,(int)(StyledWriter *)(local_b0 + 0x20),params,in_RCX);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_b0._0_8_,local_b0._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_);
      }
      Json::StyledWriter::~StyledWriter((StyledWriter *)(local_b0 + 0x20));
    }
  }
  return;
}

Assistant:

void SubscribedSignal::processSignalMetaInformation(const std::string& method, const Json::Value& params)
		{
			if(method=="subscribe") {
				/// this is the first signal related meta information to arrive!
				if(params.empty()==false) {
					m_signalReference = params[0u].asString();
				}
			} else if(method=="time") {
				m_syncSignalTime.setTime(params);
			} else if(method=="data") {
				setDataFormat(params);
			} else if(method=="signalRate") {
				try {
					std::cout << Json::StyledWriter().write(params) << std::endl;
					m_syncSignalTime.setDelta(params);
				} catch(const std::runtime_error& e) {
					std::cerr << e.what();
				}
			} else {
				std::cout << "unhandled signal related meta information '" << method << "' for signal " << m_signalReference << " with parameters: " << Json::StyledWriter().write(params) << std::endl;
			}
		}